

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  FieldGenerator *pFVar4;
  long lVar5;
  size_type sVar6;
  OneofDescriptor *pOVar7;
  int i;
  string out;
  Iterator __begin4;
  Iterator __begin3;
  Formatter format;
  Iterator __end4;
  Iterator __end3;
  int local_e4;
  string local_e0;
  Printer *local_c0;
  Iterator local_b8;
  Iterator local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_98;
  FieldGeneratorMap *local_90;
  Formatter local_88;
  Iterator local_50;
  Iterator local_40;
  
  local_e4 = 0;
  local_a8.descriptor = this->descriptor_;
  local_a8.idx = 0;
  local_40.idx = *(int *)(local_a8.descriptor + 0x6c);
  local_c0 = printer;
  local_40.descriptor = local_a8.descriptor;
  bVar3 = operator==(&local_a8,&local_40);
  if (!bVar3) {
    local_98 = &this->variables_;
    paVar1 = &local_e0.field_2;
    local_90 = &this->field_generators_;
    do {
      pOVar7 = (OneofDescriptor *)
               ((long)local_a8.idx * 0x28 + *(long *)(local_a8.descriptor + 0x30));
      local_88.printer_ = local_c0;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_88.vars_._M_t,&local_98->_M_t);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"oneofname","");
      Formatter::Set<std::__cxx11::string>
                (&local_88,&local_e0,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar7 + 8)
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      Formatter::operator()<>
                (&local_88,
                 "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
                );
      io::Printer::Indent(local_88.printer_);
      Formatter::operator()<>(&local_88,"switch ($oneofname$_case()) {\n");
      io::Printer::Indent(local_88.printer_);
      local_b8.idx = 0;
      local_50.idx = *(int *)(pOVar7 + 4);
      local_b8.descriptor = pOVar7;
      local_50.descriptor = pOVar7;
      while( true ) {
        bVar3 = operator==(&local_b8,&local_50);
        if (bVar3) break;
        lVar5 = (long)local_b8.idx;
        lVar2 = *(long *)(local_b8.descriptor + 0x20);
        UnderscoresToCamelCase(&local_e0,*(string **)(lVar2 + 8 + lVar5 * 0x48),true);
        Formatter::operator()(&local_88,"case k$1$: {\n",&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        io::Printer::Indent(local_88.printer_);
        field = (FieldDescriptor *)(lVar2 + lVar5 * 0x48);
        bVar3 = IsStringOrMessage(field);
        if (bVar3) {
          pFVar4 = FieldGeneratorMap::get(local_90,field);
          (*pFVar4->_vptr_FieldGenerator[10])(pFVar4,local_c0);
        }
        else {
          Formatter::operator()<>(&local_88,"// No need to clear\n");
        }
        Formatter::operator()<>(&local_88,"break;\n");
        io::Printer::Outdent(local_88.printer_);
        Formatter::operator()<>(&local_88,"}\n");
        local_b8.idx = local_b8.idx + 1;
      }
      lVar2 = **(long **)(pOVar7 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,lVar2,(*(long **)(pOVar7 + 8))[1] + lVar2);
      if (local_e0._M_string_length != 0) {
        sVar6 = 0;
        do {
          if ((byte)(local_e0._M_dataplus._M_p[sVar6] + 0x9fU) < 0x1a) {
            local_e0._M_dataplus._M_p[sVar6] = local_e0._M_dataplus._M_p[sVar6] + -0x20;
          }
          sVar6 = sVar6 + 1;
        } while (local_e0._M_string_length != sVar6);
      }
      Formatter::operator()(&local_88,"case $1$_NOT_SET: {\n  break;\n}\n",&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      io::Printer::Outdent(local_88.printer_);
      lVar2 = **(long **)(pOVar7 + 8);
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,lVar2,(*(long **)(pOVar7 + 8))[1] + lVar2);
      if (local_e0._M_string_length != 0) {
        sVar6 = 0;
        do {
          if ((byte)(local_e0._M_dataplus._M_p[sVar6] + 0x9fU) < 0x1a) {
            local_e0._M_dataplus._M_p[sVar6] = local_e0._M_dataplus._M_p[sVar6] + -0x20;
          }
          sVar6 = sVar6 + 1;
        } while (local_e0._M_string_length != sVar6);
      }
      Formatter::operator()(&local_88,"}\n_oneof_case_[$1$] = $2$_NOT_SET;\n",&local_e4,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      io::Printer::Outdent(local_88.printer_);
      Formatter::operator()<>(&local_88,"}\n\n");
      local_e4 = local_e4 + 1;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_88.vars_._M_t);
      local_a8.idx = local_a8.idx + 1;
      bVar3 = operator==(&local_a8,&local_40);
    } while (!bVar3);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* printer) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(printer, variables_);
    format.Set("oneofname", oneof->name());

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field) || IsFieldStripped(field, options_)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "_oneof_case_[$1$] = $2$_NOT_SET;\n",
        i, ToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    i++;
  }
}